

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit(AnalysisScopeVisitor *this,NetSymbol *symbol)

{
  optional<slang::DiagCode> *in_RSI;
  ValueSymbol *in_stack_00000018;
  AnalysisScopeVisitor *in_stack_00000020;
  optional<slang::DiagCode> in_stack_00000028;
  optional<slang::DiagCode> in_stack_0000002e;
  DiagCode in_stack_00000034;
  DiagCode *in_stack_ffffffffffffff88;
  optional<slang::DiagCode> *in_stack_ffffffffffffff90;
  NetSymbol *in_stack_ffffffffffffff98;
  AnalysisScopeVisitor *in_stack_ffffffffffffffa0;
  
  visitExprs<slang::ast::NetSymbol>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (((uint)in_RSI[0x3a].super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
             super__Optional_payload_base<slang::DiagCode>._M_payload & 1) == 0) {
    std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
              (in_RSI,in_stack_ffffffffffffff88);
    std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
              (in_RSI,in_stack_ffffffffffffff88);
    checkValueUnused(in_stack_00000020,in_stack_00000018,in_stack_00000034,in_stack_0000002e,
                     in_stack_00000028);
  }
  else {
    std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::optional<slang::DiagCode>::optional<const_slang::DiagCode_&,_true>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    checkValueUnused(in_stack_00000020,in_stack_00000018,in_stack_00000034,in_stack_0000002e,
                     in_stack_00000028);
  }
  return;
}

Assistant:

void visit(const NetSymbol& symbol) {
        visitExprs(symbol);

        if (symbol.isImplicit) {
            checkValueUnused(symbol, diag::UnusedImplicitNet, diag::UnusedImplicitNet,
                             diag::UnusedImplicitNet);
        }
        else {
            checkValueUnused(symbol, diag::UnusedNet, diag::UndrivenNet, diag::UnusedButSetNet);
        }
    }